

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O1

int mp_check(char **data,char *end)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  byte *pbVar6;
  ulong uVar7;
  ushort uVar8;
  byte *pbVar9;
  
  lVar5 = 1;
  pbVar6 = (byte *)*data;
  do {
    if (pbVar6 == (byte *)end) {
      return 1;
    }
    bVar1 = *pbVar6;
    pbVar9 = pbVar6 + 1;
    *data = (char *)pbVar9;
    cVar2 = ""[bVar1];
    uVar7 = (ulong)cVar2;
    if (-1 < (long)uVar7) {
      if ((ulong)((long)end - (long)pbVar9) < uVar7) goto LAB_00107a4d;
      pbVar9 = pbVar9 + uVar7;
      *data = (char *)pbVar9;
LAB_001078b7:
      bVar4 = false;
      goto LAB_001078c0;
    }
    if (-0x20 < cVar2) {
      lVar5 = lVar5 - uVar7;
      goto LAB_001078b7;
    }
    switch(cVar2) {
    case -0x29:
      bVar4 = true;
      if (4 < (ulong)((long)end - (long)pbVar9)) {
        uVar3 = *(uint *)(pbVar6 + 1);
        uVar7 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                       uVar3 << 0x18);
        pbVar9 = pbVar6 + 6;
LAB_00107a1c:
        *data = (char *)pbVar9;
LAB_00107a89:
        bVar4 = true;
        if (uVar7 <= (ulong)((long)end - (long)pbVar9)) {
          pbVar9 = pbVar9 + uVar7;
          *data = (char *)pbVar9;
          goto LAB_00107a98;
        }
      }
      break;
    case -0x28:
      bVar4 = true;
      if (2 < (ulong)((long)end - (long)pbVar9)) {
        uVar8 = *(ushort *)(pbVar6 + 1) << 8 | *(ushort *)(pbVar6 + 1) >> 8;
        pbVar9 = pbVar6 + 4;
LAB_00107a7c:
        *data = (char *)pbVar9;
        uVar7 = (ulong)uVar8;
        goto LAB_00107a89;
      }
      break;
    case -0x27:
      bVar4 = true;
      if (1 < (ulong)((long)end - (long)pbVar9)) {
        uVar7 = (ulong)pbVar6[1];
        pbVar9 = pbVar6 + 3;
        goto LAB_00107a1c;
      }
      break;
    case -0x26:
      if (3 < (ulong)((long)end - (long)pbVar9)) {
        uVar3 = *(uint *)(pbVar6 + 1);
        pbVar9 = pbVar6 + 5;
        *data = (char *)pbVar9;
        uVar7 = (ulong)((uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                        uVar3 << 0x18) * 2);
        goto LAB_00107a48;
      }
LAB_00107a4d:
      bVar4 = true;
      break;
    case -0x25:
      if ((ulong)((long)end - (long)pbVar9) < 2) goto LAB_00107a4d;
      uVar8 = *(ushort *)(pbVar6 + 1);
      pbVar9 = pbVar6 + 3;
      *data = (char *)pbVar9;
      lVar5 = lVar5 + (ulong)(ushort)(uVar8 << 8 | uVar8 >> 8) * 2;
      goto LAB_00107a98;
    case -0x24:
      if ((ulong)((long)end - (long)pbVar9) < 4) goto LAB_00107a4d;
      uVar3 = *(uint *)(pbVar6 + 1);
      uVar7 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                     uVar3 << 0x18);
      pbVar9 = pbVar6 + 5;
      *data = (char *)pbVar9;
      goto LAB_00107a48;
    case -0x23:
      if ((ulong)((long)end - (long)pbVar9) < 2) goto LAB_00107a4d;
      uVar8 = *(ushort *)(pbVar6 + 1);
      pbVar9 = pbVar6 + 3;
      *data = (char *)pbVar9;
      uVar7 = (ulong)(ushort)(uVar8 << 8 | uVar8 >> 8);
LAB_00107a48:
      lVar5 = lVar5 + uVar7;
LAB_00107a98:
      bVar4 = false;
      break;
    case -0x22:
      bVar4 = true;
      if (3 < (ulong)((long)end - (long)pbVar9)) {
        uVar3 = *(uint *)(pbVar6 + 1);
        uVar7 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                       uVar3 << 0x18);
        pbVar9 = pbVar6 + 5;
        goto LAB_00107a1c;
      }
      break;
    case -0x21:
      bVar4 = true;
      if (1 < (ulong)((long)end - (long)pbVar9)) {
        uVar8 = *(ushort *)(pbVar6 + 1) << 8 | *(ushort *)(pbVar6 + 1) >> 8;
        pbVar9 = pbVar6 + 3;
        goto LAB_00107a7c;
      }
      break;
    case -0x20:
      bVar4 = true;
      if (pbVar9 != (byte *)end) {
        uVar7 = (ulong)pbVar6[1];
        pbVar9 = pbVar6 + 2;
        goto LAB_00107a1c;
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                    ,0xa27,"int mp_check(const char **, const char *)");
    }
LAB_001078c0:
    if (bVar4) {
      return 1;
    }
    bVar4 = lVar5 < 2;
    lVar5 = lVar5 + -1;
    pbVar6 = pbVar9;
    if (bVar4) {
      if (*data <= end) {
        return 0;
      }
      __assert_fail("*data <= end",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                    ,0xa2b,"int mp_check(const char **, const char *)");
    }
  } while( true );
}

Assistant:

MP_IMPL int
mp_check(const char **data, const char *end)
{
#define MP_CHECK_LEN(_l) \
	if (mp_unlikely((size_t)(end - *data) < (size_t)(_l))) \
		return 1;

	int64_t k;
	for (k = 1; k > 0; k--) {
		MP_CHECK_LEN(1);
		uint8_t c = mp_load_u8(data);
		int l = mp_parser_hint[c];
		if (mp_likely(l >= 0)) {
			MP_CHECK_LEN(l);
			*data += l;
			continue;
		} else if (mp_likely(l > MP_HINT)) {
			k -= l;
			continue;
		}

		uint32_t len;
		switch (l) {
		case MP_HINT_STR_8:
			/* MP_STR (8) */
			MP_CHECK_LEN(sizeof(uint8_t));
			len = mp_load_u8(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_STR_16:
			/* MP_STR (16) */
			MP_CHECK_LEN(sizeof(uint16_t));
			len = mp_load_u16(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_STR_32:
			/* MP_STR (32) */
			MP_CHECK_LEN(sizeof(uint32_t))
			len = mp_load_u32(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_ARRAY_16:
			/* MP_ARRAY (16) */
			MP_CHECK_LEN(sizeof(uint16_t));
			k += mp_load_u16(data);
			break;
		case MP_HINT_ARRAY_32:
			/* MP_ARRAY (32) */
			MP_CHECK_LEN(sizeof(uint32_t));
			k += mp_load_u32(data);
			break;
		case MP_HINT_MAP_16:
			/* MP_MAP (16) */
			MP_CHECK_LEN(sizeof(uint16_t));
			k += 2 * mp_load_u16(data);
			break;
		case MP_HINT_MAP_32:
			/* MP_MAP (32) */
			MP_CHECK_LEN(sizeof(uint32_t));
			k += 2 * mp_load_u32(data);
			break;
		case MP_HINT_EXT_8:
			/* MP_EXT (8) */
			MP_CHECK_LEN(sizeof(uint8_t) + sizeof(uint8_t));
			len = mp_load_u8(data);
			mp_load_u8(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_EXT_16:
			/* MP_EXT (16) */
			MP_CHECK_LEN(sizeof(uint16_t) + sizeof(uint8_t));
			len = mp_load_u16(data);
			mp_load_u8(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_EXT_32:
			/* MP_EXT (32) */
			MP_CHECK_LEN(sizeof(uint32_t) + sizeof(uint8_t));
			len = mp_load_u32(data);
			mp_load_u8(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		default:
			mp_unreachable();
		}
	}

	assert(*data <= end);
#undef MP_CHECK_LEN
	return 0;
}